

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdp.cpp
# Opt level: O2

POMCPPrior * __thiscall despot::DSPOMDP::CreatePOMCPPrior(DSPOMDP *this,string *name)

{
  bool bVar1;
  POMCPPrior *this_00;
  ostream *poVar2;
  
  bVar1 = std::operator==(name,"UNIFORM");
  if (!bVar1) {
    bVar1 = std::operator==(name,"DEFAULT");
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Unsupported POMCP prior: ");
      poVar2 = std::operator<<(poVar2,(string *)name);
      std::endl<char,std::char_traits<char>>(poVar2);
      exit(1);
    }
  }
  this_00 = (POMCPPrior *)operator_new(0x78);
  UniformPOMCPPrior::UniformPOMCPPrior((UniformPOMCPPrior *)this_00,this);
  return this_00;
}

Assistant:

POMCPPrior* DSPOMDP::CreatePOMCPPrior(string name) const {
	if (name == "UNIFORM" || name == "DEFAULT") {
		return new UniformPOMCPPrior(this);
	} else {
		cerr << "Unsupported POMCP prior: " << name << endl;
		exit(1);
		return NULL;
	}
}